

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

void GraphTask::del_edge_features(task_data *param_1,uint32_t n,multi_ex *ec)

{
  reference ppeVar1;
  size_t sVar2;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  uint in_ESI;
  features *fs;
  undefined4 in_stack_ffffffffffffffd0;
  float fVar3;
  
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(ulong)in_ESI);
  v_array<unsigned_char>::pop((v_array<unsigned_char> *)*ppeVar1);
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(ulong)in_ESI);
  fVar3 = ((*ppeVar1)->super_example_predict).feature_space[0x83].sum_feat_sq;
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(ulong)in_ESI);
  (*ppeVar1)->total_sum_feat_sq = (*ppeVar1)->total_sum_feat_sq - fVar3;
  sVar2 = features::size((features *)0x166643);
  ppeVar1 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,(ulong)in_ESI);
  (*ppeVar1)->num_features = (*ppeVar1)->num_features - sVar2;
  features::clear((features *)CONCAT44(fVar3,in_stack_ffffffffffffffd0));
  return;
}

Assistant:

void del_edge_features(task_data& /*D*/, uint32_t n, multi_ex& ec)
{
  ec[n]->indices.pop();
  features& fs = ec[n]->feature_space[neighbor_namespace];
  ec[n]->total_sum_feat_sq -= fs.sum_feat_sq;
  ec[n]->num_features -= fs.size();
  fs.clear();
}